

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_CALLNZ(Context *ctx)

{
  char local_98 [8];
  char src1 [64];
  char src0 [64];
  Context *ctx_local;
  
  make_METAL_srcarg_string_masked(ctx,0,src1 + 0x38,0x40);
  make_METAL_srcarg_string_masked(ctx,1,local_98,0x40);
  if (ctx->loops < 1) {
    output_line(ctx,"if (%s) { %s(); }",local_98,src1 + 0x38);
  }
  else {
    output_line(ctx,"if (%s) { %s(aL); }",local_98,src1 + 0x38);
  }
  return;
}

Assistant:

static void emit_METAL_CALLNZ(Context *ctx)
{
    // !!! FIXME: if src1 is a constbool that's true, we can remove the
    // !!! FIXME:  if. If it's false, we can make this a no-op.
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));

    if (ctx->loops > 0)
        output_line(ctx, "if (%s) { %s(aL); }", src1, src0);
    else
        output_line(ctx, "if (%s) { %s(); }", src1, src0);
}